

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

HighsStatus __thiscall HEkk::setBasis(HEkk *this)

{
  double dVar1;
  double val;
  int num_col;
  uint num_row;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int index;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  num_col = (this->lp_).num_col_;
  lVar6 = (long)num_col;
  num_row = (this->lp_).num_row_;
  SimplexBasis::setup(&this->basis_,num_col,num_row);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->basis_).debug_origin_name,0,
             (char *)(this->basis_).debug_origin_name._M_string_length,0x3d942c);
  if (0 < lVar6) {
    lVar5 = 0;
    do {
      (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar5] = '\x01';
      dVar1 = (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5];
      val = (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5];
      if ((dVar1 != val) || (NAN(dVar1) || NAN(val))) {
        bVar2 = highs_isInfinity(-dVar1);
        bVar3 = highs_isInfinity(val);
        if (bVar2) {
          bVar4 = bVar3 - 1;
        }
        else {
          bVar4 = 1;
          if (!bVar3) {
            bVar4 = -(ABS(val) <= ABS(dVar1)) | 1;
          }
        }
      }
      else {
        bVar4 = 0;
      }
      (this->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar5] = bVar4;
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  if (0 < (int)num_row) {
    uVar7 = 0;
    do {
      (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar7 + lVar6] = '\0';
      index = (int)uVar7 + num_col;
      HighsHashHelpers::sparse_combine(&(this->basis_).hash,index);
      (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] = index;
      uVar7 = uVar7 + 1;
    } while (num_row != uVar7);
  }
  (this->info_).num_basic_logicals = num_row;
  (this->status_).has_basis = true;
  return kOk;
}

Assistant:

HighsStatus HEkk::setBasis() {
  // Set up nonbasicFlag and basicIndex for a logical basis
  const HighsInt num_col = lp_.num_col_;
  const HighsInt num_row = lp_.num_row_;

  basis_.setup(num_col, num_row);
  basis_.debug_origin_name = "HEkk::setBasis - logical";

  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    basis_.nonbasicFlag_[iCol] = kNonbasicFlagTrue;
    double lower = lp_.col_lower_[iCol];
    double upper = lp_.col_upper_[iCol];
    int8_t move = kIllegalMoveValue;
    if (lower == upper) {
      // Fixed
      move = kNonbasicMoveZe;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed. Set to bound of LP that is closer to
        // zero
        if (move == kIllegalMoveValue) {
          if (fabs(lower) < fabs(upper)) {
            move = kNonbasicMoveUp;
          } else {
            move = kNonbasicMoveDn;
          }
        }
      } else {
        // Lower (since upper bound is infinite)
        move = kNonbasicMoveUp;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      move = kNonbasicMoveDn;
    } else {
      // FREE
      move = kNonbasicMoveZe;
    }
    assert(move != kIllegalMoveValue);
    basis_.nonbasicMove_[iCol] = move;
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt iVar = num_col + iRow;
    basis_.nonbasicFlag_[iVar] = kNonbasicFlagFalse;
    HighsHashHelpers::sparse_combine(basis_.hash, iVar);
    basis_.basicIndex_[iRow] = iVar;
  }
  info_.num_basic_logicals = num_row;
  status_.has_basis = true;
  return HighsStatus::kOk;
}